

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O1

bool parse_cpu_mask(string *mask,bool (*boolmask) [512])

{
  char cVar1;
  ulong uVar2;
  pointer pcVar3;
  char cVar4;
  short sVar7;
  short sVar8;
  short sVar9;
  undefined8 uVar10;
  ulong uVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 uVar14;
  int iVar15;
  ulong uVar16;
  common_log *pcVar17;
  ulong uVar18;
  bool *pbVar19;
  byte bVar20;
  bool bVar21;
  bool bVar22;
  undefined1 auVar23 [16];
  short sVar27;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  long *local_48 [2];
  long local_38 [2];
  char cVar5;
  char cVar6;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined2 uVar26;
  undefined4 uVar28;
  undefined6 uVar29;
  
  if (mask->_M_string_length < 2) {
    uVar18 = 0;
  }
  else {
    std::__cxx11::string::substr((ulong)local_48,(ulong)mask);
    iVar15 = std::__cxx11::string::compare((char *)local_48);
    uVar18 = (ulong)((uint)(iVar15 == 0) * 2);
    if (local_48[0] != local_38) {
      operator_delete(local_48[0],local_38[0] + 1);
    }
  }
  auVar13 = _DAT_0012e9a0;
  auVar12 = _DAT_0012e990;
  uVar2 = mask->_M_string_length;
  uVar16 = uVar2 - uVar18;
  if (0x7f < uVar16) {
    uVar16 = 0x80;
  }
  bVar22 = uVar2 == uVar18;
  if (!bVar22) {
    pcVar3 = (mask->_M_dataplus)._M_p;
    pbVar19 = *boolmask + uVar16 * 4;
    uVar16 = uVar16 + uVar18;
    do {
      pbVar19 = pbVar19 + -4;
      if (uVar2 <= uVar18) {
        uVar14 = std::__throw_out_of_range_fmt
                           ("basic_string::at: __n (which is %zu) >= this->size() (which is %zu)",
                            uVar18);
        llama_log_set(common_init::anon_class_1_0_00000001::__invoke,0);
        if (-1 < common_log_verbosity_thold) {
          pcVar17 = common_log_main();
          common_log_add(pcVar17,GGML_LOG_LEVEL_INFO,"build: %d (%s) with %s for %s%s\n",
                         (ulong)(uint)LLAMA_BUILD_NUMBER,LLAMA_COMMIT,LLAMA_COMPILER,
                         LLAMA_BUILD_TARGET,"");
        }
        return (bool)uVar14;
      }
      cVar1 = pcVar3[uVar18];
      bVar20 = cVar1 - 0x30;
      if (9 < bVar20) {
        if ((byte)(cVar1 + 0x9fU) < 6) {
          bVar20 = cVar1 + 0xa9;
        }
        else {
          if (5 < (byte)(cVar1 + 0xbfU)) {
            if (common_log_verbosity_thold < 0) {
              return bVar22;
            }
            pcVar17 = common_log_main();
            common_log_add(pcVar17,GGML_LOG_LEVEL_ERROR,
                           "Invalid hex character \'%c\' at position %d\n",(ulong)(uint)(int)cVar1,
                           uVar18 & 0xffffffff);
            return bVar22;
          }
          bVar20 = cVar1 - 0x37;
        }
      }
      uVar28 = *(undefined4 *)pbVar19;
      uVar14 = (undefined1)((uint)uVar28 >> 0x18);
      uVar26 = CONCAT11(uVar14,uVar14);
      uVar14 = (undefined1)((uint)uVar28 >> 0x10);
      uVar10 = CONCAT35(CONCAT21(uVar26,uVar14),CONCAT14(uVar14,uVar28));
      uVar14 = (undefined1)((uint)uVar28 >> 8);
      uVar29 = CONCAT51(CONCAT41((int)((ulong)uVar10 >> 0x20),uVar14),uVar14);
      auVar32._0_2_ = CONCAT11((char)uVar28,(char)uVar28);
      uVar11 = CONCAT62(uVar29,auVar32._0_2_);
      auVar25._8_4_ = 0;
      auVar25._0_8_ = uVar11;
      auVar25._12_2_ = uVar26;
      auVar25._14_2_ = uVar26;
      uVar26 = (undefined2)((ulong)uVar10 >> 0x20);
      auVar24._12_4_ = auVar25._12_4_;
      auVar24._8_2_ = 0;
      auVar24._0_8_ = uVar11;
      auVar24._10_2_ = uVar26;
      auVar23._10_6_ = auVar24._10_6_;
      auVar23._8_2_ = uVar26;
      auVar23._0_8_ = uVar11;
      uVar26 = (undefined2)uVar29;
      auVar32._8_8_ = auVar23._8_8_;
      auVar32._6_2_ = uVar26;
      auVar32._4_2_ = uVar26;
      auVar32._2_2_ = auVar32._0_2_;
      auVar30._1_3_ = 0;
      auVar30[0] = bVar20;
      auVar30[4] = bVar20;
      auVar30._5_3_ = 0;
      auVar30[8] = bVar20;
      auVar30._9_3_ = 0;
      auVar30[0xc] = bVar20;
      auVar30._13_3_ = 0;
      auVar30 = auVar30 & auVar12;
      auVar31._0_4_ = -(uint)(auVar30._0_4_ == auVar12._0_4_);
      auVar31._4_4_ = -(uint)(auVar30._4_4_ == auVar12._4_4_);
      auVar31._8_4_ = -(uint)(auVar30._8_4_ == auVar12._8_4_);
      auVar31._12_4_ = -(uint)(auVar30._12_4_ == auVar12._12_4_);
      auVar32 = (auVar31 | auVar32) & auVar13;
      sVar7 = auVar32._0_2_;
      cVar1 = (0 < sVar7) * (sVar7 < 0x100) * auVar32[0] - (0xff < sVar7);
      sVar7 = auVar32._2_2_;
      sVar27 = CONCAT11((0 < sVar7) * (sVar7 < 0x100) * auVar32[2] - (0xff < sVar7),cVar1);
      sVar7 = auVar32._4_2_;
      cVar4 = (0 < sVar7) * (sVar7 < 0x100) * auVar32[4] - (0xff < sVar7);
      sVar7 = auVar32._6_2_;
      uVar28 = CONCAT13((0 < sVar7) * (sVar7 < 0x100) * auVar32[6] - (0xff < sVar7),
                        CONCAT12(cVar4,sVar27));
      sVar7 = auVar32._8_2_;
      cVar5 = (0 < sVar7) * (sVar7 < 0x100) * auVar32[8] - (0xff < sVar7);
      sVar7 = auVar32._10_2_;
      uVar29 = CONCAT15((0 < sVar7) * (sVar7 < 0x100) * auVar32[10] - (0xff < sVar7),
                        CONCAT14(cVar5,uVar28));
      sVar7 = auVar32._12_2_;
      cVar6 = (0 < sVar7) * (sVar7 < 0x100) * auVar32[0xc] - (0xff < sVar7);
      sVar9 = auVar32._14_2_;
      sVar7 = (short)((uint)uVar28 >> 0x10);
      sVar8 = (short)((uint6)uVar29 >> 0x20);
      sVar9 = (short)(CONCAT17((0 < sVar9) * (sVar9 < 0x100) * auVar32[0xe] - (0xff < sVar9),
                               CONCAT16(cVar6,uVar29)) >> 0x30);
      *(uint *)pbVar19 =
           CONCAT13((0 < sVar9) * (sVar9 < 0x100) * cVar6 - (0xff < sVar9),
                    CONCAT12((0 < sVar8) * (sVar8 < 0x100) * cVar5 - (0xff < sVar8),
                             CONCAT11((0 < sVar7) * (sVar7 < 0x100) * cVar4 - (0xff < sVar7),
                                      (0 < sVar27) * (sVar27 < 0x100) * cVar1 - (0xff < sVar27))));
      uVar18 = uVar18 + 1;
      bVar21 = uVar18 < uVar16;
      bVar22 = !bVar21;
    } while (bVar21);
  }
  return bVar22;
}

Assistant:

bool parse_cpu_mask(const std::string & mask, bool (&boolmask)[GGML_MAX_N_THREADS]) {
    // Discard potential 0x prefix
    size_t start_i = 0;
    if (mask.length() >= 2 && mask.substr(0, 2) == "0x") {
        start_i = 2;
    }

    size_t num_digits = mask.length() - start_i;
    if (num_digits > 128) num_digits = 128;

    size_t end_i = num_digits + start_i;

    for (size_t i = start_i, n = (num_digits*4 - 1); i < end_i; i++, n-=4) {
        char c = mask.at(i);
        int8_t id = c;

        if ((c >= '0' && c <= '9')) {
            id -= '0';
        } else if (c >= 'a' && c <= 'f') {
            id -= 'a' - 10;
        } else if (c >= 'A' && c <= 'F') {
            id -= 'A' - 10;
        } else {
            LOG_ERR("Invalid hex character '%c' at position %d\n", c, int32_t(i));
            return false;
        }

        boolmask[  n  ] = boolmask[  n  ] || ((id & 8) != 0);
        boolmask[n - 1] = boolmask[n - 1] || ((id & 4) != 0);
        boolmask[n - 2] = boolmask[n - 2] || ((id & 2) != 0);
        boolmask[n - 3] = boolmask[n - 3] || ((id & 1) != 0);
    }

    return true;
}